

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::PushBigChunk(ON_BinaryArchive *this,ON__UINT32 typecode,ON__INT64 big_value)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ON_3DM_BIG_CHUNK local_48;
  
  local_48.m_do_crc16 = '\0';
  local_48.m_do_crc32 = '\0';
  local_48.m_crc16 = 0;
  local_48.m_crc32 = 0;
  local_48._28_4_ = 0;
  local_48.m_typecode = typecode;
  if (-1 < (int)typecode) {
    if (typecode == 0) {
      if (-1 < big_value) {
        uVar3 = 0;
        uVar4 = 0;
        if (this->m_3dm_version == 1) goto LAB_0039e8ce;
LAB_0039e865:
        iVar1 = this->m_3dm_version;
        if ((typecode >> 0x10 & 1) == 0 || iVar1 != 1) {
          if (typecode == 0x2fffd) {
            if (iVar1 == 1) goto LAB_0039e89f;
LAB_0039e93f:
            local_48.m_do_crc16 = '\0';
            local_48.m_do_crc32 = '\x01';
            local_48.m_crc16 = 0;
            local_48.m_crc32 = 0;
          }
          else if (typecode == 0x2000013) {
            if (iVar1 == 1) goto LAB_0039e89f;
          }
          else if ((short)typecode < 0 && iVar1 != 1) goto LAB_0039e93f;
        }
        else {
LAB_0039e89f:
          local_48.m_do_crc16 = '\x01';
          local_48.m_do_crc32 = '\0';
          local_48.m_crc16 = 1;
          local_48.m_crc32 = 0;
        }
        local_48.m_bLongChunk = 1;
        local_48._29_3_ = 0;
        uVar3 = 4;
        uVar4 = big_value;
        if (local_48.m_do_crc32 == '\0') {
          uVar3 = (ulong)((uint)(local_48.m_do_crc16 != '\0') * 2);
        }
        goto LAB_0039e8ce;
      }
    }
    else if (-1 < big_value) goto LAB_0039e865;
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_0039e8ce:
  local_48.m_start_offset = this->m_current_positionX;
  local_48.m_end_offset = local_48.m_start_offset;
  local_48.m_big_value = big_value;
  bVar2 = ReadMode(this);
  if ((bVar2) && (uVar3 <= uVar4 && uVar4 - uVar3 != 0)) {
    local_48.m_end_offset = local_48.m_end_offset + (uVar4 - uVar3);
  }
  this->m_bDoChunkCRC = local_48.m_do_crc32 != '\0' || local_48.m_do_crc16 != '\0';
  if ((this->m_chunk).m_capacity == 0) {
    ON_SimpleArray<ON_3DM_BIG_CHUNK>::SetCapacity(&this->m_chunk,0x80);
  }
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(&this->m_chunk,&local_48);
  return true;
}

Assistant:

bool ON_BinaryArchive::PushBigChunk( ON__UINT32 typecode, ON__INT64 big_value )
{
  ON_3DM_BIG_CHUNK c;
  memset(&c,0,sizeof(c));
  c.m_typecode  = typecode;
  c.m_big_value = big_value;
  ON__UINT64 length = 0;
  ON__UINT64 sizeof_crc = 0;

  // | and & are BITOPS - do NOT change to || and &&
  //
  // Some v1 files have a short chunk with typecode = 0.
  //
  // NOTE: RenderXXXX plug-in used zero as a typecode in material userdata, sigh ...
  // so ... const bool bLongChunk = (0 != typecode && 0 == (TCODE_SHORT & typecode)); doesn't work.
  //
  const bool bLongChunk = (0 == (TCODE_SHORT & typecode) && (0 != typecode || 1 != Archive3dmVersion()) && big_value >= 0 );
  if ( bLongChunk )
  {
    length = (ON__UINT64)big_value;

    if ( m_3dm_version == 1 && 0 != (TCODE_LEGACY_GEOMETRY & typecode) )
    {
      // these legacy typecodes have 16 bit CRCs
      c.m_do_crc16 = 1;
      c.m_crc16 = 1;
    }
    else 
    {
      // some other legacy typecodes that have 16 bit CRCs
      switch(typecode) 
      {

      case TCODE_SUMMARY:
        if ( m_3dm_version == 1 ) 
        {
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        break;

      case TCODE_OPENNURBS_OBJECT | TCODE_CRC | 0x7FFD:
        if ( m_3dm_version == 1 ) 
        {
          // 1.1 uuid has a 16 bit crc
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        else 
        {
          // 2.0 uuid has a 32 bit crc
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      default:
        if ( m_3dm_version != 1 && 0 != (TCODE_CRC & typecode) ) 
        {
          // 32 bit CRC
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      }
    }

    c.m_bLongChunk = 1;
    sizeof_crc = c.m_do_crc32 ? 4 : (c.m_do_crc16 ? 2 : 0);
  }

  c.m_start_offset = CurrentPosition();
  c.m_end_offset = c.m_start_offset;
  if (ReadMode() && length > sizeof_crc)
    c.m_end_offset += (length - sizeof_crc);
  m_bDoChunkCRC = c.m_do_crc16 || c.m_do_crc32;
  
  if ( m_chunk.Capacity() == 0 )
    m_chunk.Reserve(128);
  m_chunk.Append( c );

  return true;
}